

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineTemplate.h
# Opt level: O0

void __thiscall
kiste::LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::
render_text<kiste::line_t>
          (LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *this,line_t *line)

{
  bool bVar1;
  vector<kiste::segment_t,_std::allocator<kiste::segment_t>_> *this_00;
  reference psVar2;
  byte local_51;
  segment_t *segment;
  const_iterator __end0;
  const_iterator __begin0;
  vector<kiste::segment_t,_std::allocator<kiste::segment_t>_> *__range3;
  ulong uStack_20;
  bool string_opened;
  size_t i;
  line_t *line_local;
  LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *this_local;
  
  i = (size_t)line;
  line_local = (line_t *)this;
  for (uStack_20 = 0; uStack_20 < *(ulong *)(i + 0xa0); uStack_20 = uStack_20 + 1) {
    cpp::text(this->_serialize,"  ");
  }
  bVar1 = line_t::starts_with_text((line_t *)i);
  local_51 = 0;
  if (bVar1) {
    local_51 = *(byte *)(i + 0xa8);
  }
  __range3._7_1_ = local_51 & 1;
  if (__range3._7_1_ != 0) {
    cpp::text(this->_serialize,"                ");
  }
  this_00 = (vector<kiste::segment_t,_std::allocator<kiste::segment_t>_> *)(i + 8);
  __end0 = std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::begin(this_00);
  segment = (segment_t *)
            std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_kiste::segment_t_*,_std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>_>
                                     *)&segment), bVar1) {
    psVar2 = __gnu_cxx::
             __normal_iterator<const_kiste::segment_t_*,_std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>_>
             ::operator*(&__end0);
    switch(psVar2->_type) {
    case cpp:
      break;
    case text:
      open_string(this,(bool *)((long)&__range3 + 7));
      text_segment(this,&psVar2->_text);
      break;
    case trim_trailing_return:
      break;
    case escape:
      close_string(this,(bool *)((long)&__range3 + 7));
      escape(this,&psVar2->_text);
      break;
    case raw:
      close_string(this,(bool *)((long)&__range3 + 7));
      raw(this,&psVar2->_text);
      break;
    case call:
      close_string(this,(bool *)((long)&__range3 + 7));
      call(this,&psVar2->_text);
    }
    __gnu_cxx::
    __normal_iterator<const_kiste::segment_t_*,_std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>_>
    ::operator++(&__end0);
  }
  if ((*(byte *)(i + 0xa9) & 1) == 0) {
    close_string(this,(bool *)((long)&__range3 + 7));
  }
  cpp::text(this->_serialize,"\n");
  return;
}

Assistant:

void render_text(const Line& line)
    {
      for (std::size_t i = 0; i < line._curly_level; ++i)
      {
        _serialize.text("  ");
      }
      auto string_opened = line.starts_with_text() && line._previous_line_ends_with_text;
      if (string_opened)
      {
        _serialize.text("                ");
      }
      for (const auto& segment : line._segments)
      {
        switch (segment._type)
        {
        case segment_type::cpp:
          break;
        case segment_type::text:
          static_assert(std::is_same<decltype(open_string(string_opened)), void>::value,
                        "$call{} requires void expression");
          (open_string(string_opened));
          static_assert(std::is_same<decltype(text_segment(segment._text)), void>::value,
                        "$call{} requires void expression");
          (text_segment(segment._text));
          break;
        case segment_type::trim_trailing_return:
          break;
        case segment_type::escape:
          static_assert(std::is_same<decltype(close_string(string_opened)), void>::value,
                        "$call{} requires void expression");
          (close_string(string_opened));
          static_assert(std::is_same<decltype(escape(segment._text)), void>::value,
                        "$call{} requires void expression");
          (escape(segment._text));
          break;
        case segment_type::call:
          static_assert(std::is_same<decltype(close_string(string_opened)), void>::value,
                        "$call{} requires void expression");
          (close_string(string_opened));
          static_assert(std::is_same<decltype(call(segment._text)), void>::value,
                        "$call{} requires void expression");
          (call(segment._text));
          break;
        case segment_type::raw:
          static_assert(std::is_same<decltype(close_string(string_opened)), void>::value,
                        "$call{} requires void expression");
          (close_string(string_opened));
          static_assert(std::is_same<decltype(raw(segment._text)), void>::value,
                        "$call{} requires void expression");
          (raw(segment._text));
          break;
        }
      }
      if (not line._next_line_starts_with_text)
      {
        static_assert(std::is_same<decltype(close_string(string_opened)), void>::value,
                      "$call{} requires void expression");
        (close_string(string_opened));
      }
      _serialize.text("\n");
    }